

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall Potassco::AspifTextInput::matchRule(AspifTextInput *this,char c)

{
  bool bVar1;
  char c_00;
  char in_SIL;
  AspifTextInput *in_RDI;
  bool in_stack_0000003f;
  char *in_stack_00000040;
  AspifTextInput *in_stack_00000048;
  AbstractProgram *in_stack_00000070;
  RuleBuilder *in_stack_00000078;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 skipws;
  Weight_t bound;
  Data *in_stack_ffffffffffffffd0;
  RuleBuilder *in_stack_ffffffffffffffe8;
  Head_t in_stack_fffffffffffffff0;
  undefined3 in_stack_fffffffffffffff4;
  Head_t ht;
  
  skipws = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  ht.val_ = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  if (in_SIL == '{') {
    match(in_stack_00000048,in_stack_00000040,in_stack_0000003f);
    Head_t::Head_t((Head_t *)&stack0xfffffffffffffff0,Choice);
    RuleBuilder::start(in_stack_ffffffffffffffe8,ht);
    matchAtoms((AspifTextInput *)CONCAT44(ht.val_,in_stack_fffffffffffffff0.val_),
               (char *)in_stack_ffffffffffffffe8);
    match(in_stack_00000048,in_stack_00000040,in_stack_0000003f);
  }
  else {
    in_stack_ffffffffffffffd0 = in_RDI->data_;
    Head_t::Head_t((Head_t *)&stack0xffffffffffffffec,Disjunctive);
    RuleBuilder::start(in_stack_ffffffffffffffe8,ht);
    matchAtoms((AspifTextInput *)CONCAT44(ht.val_,in_stack_fffffffffffffff0.val_),
               (char *)in_stack_ffffffffffffffe8);
  }
  bVar1 = match(in_stack_00000048,in_stack_00000040,in_stack_0000003f);
  if (bVar1) {
    c_00 = ProgramReader::peek((ProgramReader *)in_stack_ffffffffffffffd0,(bool)skipws);
    bVar1 = BufferedStream::isDigit(c_00);
    if ((bVar1) || (c_00 == '-')) {
      bound = (Weight_t)((ulong)in_RDI->data_ >> 0x20);
      matchInt((AspifTextInput *)in_stack_ffffffffffffffd0);
      RuleBuilder::startSum(&in_stack_ffffffffffffffd0->rule,bound);
      matchAgg(in_RDI);
    }
    else {
      RuleBuilder::startBody(&in_stack_ffffffffffffffd0->rule);
      matchLits((AspifTextInput *)in_stack_ffffffffffffffd0);
    }
  }
  match(in_stack_00000048,in_stack_00000040,in_stack_0000003f);
  RuleBuilder::end(in_stack_00000078,in_stack_00000070);
  return;
}

Assistant:

void AspifTextInput::matchRule(char c) {
	if (c == '{') { match("{"); data_->rule.start(Head_t::Choice); matchAtoms(";,"); match("}"); }
	else          { data_->rule.start(); matchAtoms(";|"); }
	if (match(":-", false)) {
		c = peek(true);
		if (!StreamType::isDigit(c) && c != '-') {
			data_->rule.startBody();
			matchLits();
		}
		else {
			data_->rule.startSum(matchInt());
			matchAgg();
		}
	}
	match(".");
	data_->rule.end(out_);
}